

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

void hostcache_unlink_entry(void *entry)

{
  long *plVar1;
  
  plVar1 = (long *)((long)entry + 0x10);
  *plVar1 = *plVar1 + -1;
  if (*plVar1 != 0) {
    return;
  }
  Curl_freeaddrinfo(*entry);
  (*Curl_cfree)(entry);
  return;
}

Assistant:

static void hostcache_unlink_entry(void *entry)
{
  struct Curl_dns_entry *dns = (struct Curl_dns_entry *) entry;
  DEBUGASSERT(dns && (dns->refcount > 0));

  dns->refcount--;
  if(dns->refcount == 0) {
    Curl_freeaddrinfo(dns->addr);
#ifdef USE_HTTPSRR
    if(dns->hinfo) {
      if(dns->hinfo->target)
        free(dns->hinfo->target);
      if(dns->hinfo->alpns)
        free(dns->hinfo->alpns);
      if(dns->hinfo->ipv4hints)
        free(dns->hinfo->ipv4hints);
      if(dns->hinfo->echconfiglist)
        free(dns->hinfo->echconfiglist);
      if(dns->hinfo->ipv6hints)
        free(dns->hinfo->ipv6hints);
      if(dns->hinfo->val)
        free(dns->hinfo->val);
      free(dns->hinfo);
    }
#endif
    free(dns);
  }
}